

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

void ftxui::Render(Screen *screen,Node *node)

{
  long lVar1;
  int iVar2;
  int local_30;
  int max_iterations;
  Status status;
  Box box;
  Node *node_local;
  Screen *screen_local;
  
  Box::Box((Box *)&status);
  status.iteration = 0;
  iVar2 = Screen::dimx(screen);
  status._4_4_ = iVar2 + -1;
  iVar2 = Screen::dimy(screen);
  Node::Status::Status((Status *)&stack0xffffffffffffffd0);
  (*node->_vptr_Node[5])(node,&stack0xffffffffffffffd0);
  while (((byte)max_iterations & 1) != 0 && local_30 < 0x14) {
    (*node->_vptr_Node[2])();
    (*node->_vptr_Node[3])(node,CONCAT44(status._4_4_,status.iteration),(ulong)(iVar2 - 1U) << 0x20)
    ;
    max_iterations._0_1_ = 0;
    local_30 = local_30 + 1;
    (*node->_vptr_Node[5])(node,&stack0xffffffffffffffd0);
  }
  (screen->stencil).x_min = status.iteration;
  (screen->stencil).x_max = status._4_4_;
  lVar1 = (ulong)(iVar2 - 1U) << 0x20;
  (screen->stencil).y_min = (int)lVar1;
  (screen->stencil).y_max = (int)((ulong)lVar1 >> 0x20);
  (*node->_vptr_Node[4])(node,screen);
  Screen::ApplyShader(screen);
  return;
}

Assistant:

void Render(Screen& screen, Node* node) {
  Box box;
  box.x_min = 0;
  box.y_min = 0;
  box.x_max = screen.dimx() - 1;
  box.y_max = screen.dimy() - 1;

  Node::Status status;
  node->Check(&status);
  const int max_iterations = 20;
  while (status.need_iteration && status.iteration < max_iterations) {
    // Step 1: Find what dimension this elements wants to be.
    node->ComputeRequirement();

    // Step 2: Assign a dimension to the element.
    node->SetBox(box);

    // Check if the element needs another iteration of the layout algorithm.
    status.need_iteration = false;
    status.iteration++;
    node->Check(&status);
  }

  // Step 3: Draw the element.
  screen.stencil = box;
  node->Render(screen);

  // Step 4: Apply shaders
  screen.ApplyShader();
}